

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.hpp
# Opt level: O2

bool xercesc_4_0::XMLString::endsWith(XMLCh *toTest,XMLCh *suffix)

{
  bool bVar1;
  XMLSize_t charCount;
  XMLSize_t XVar2;
  
  charCount = stringLen(suffix);
  XVar2 = stringLen(toTest);
  bVar1 = regionMatches(toTest,(int)XVar2 - (int)charCount,suffix,0,charCount);
  return bVar1;
}

Assistant:

inline bool XMLString::endsWith(const XMLCh* const toTest,
                                const XMLCh* const suffix)
{

    XMLSize_t suffixLen = XMLString::stringLen(suffix);

    return regionMatches(toTest, (int)(XMLString::stringLen(toTest) - suffixLen),
                         suffix, 0, suffixLen);
}